

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_frame.cc
# Opt level: O2

void __thiscall pstack::Dwarf::CIE::CIE(CIE *this,CFI *fi,DWARFReader *r,Off end_)

{
  char cVar1;
  pointer pcVar2;
  size_type sVar3;
  string *psVar4;
  CIE *pCVar5;
  uint8_t uVar6;
  byte bVar7;
  uintmax_t uVar8;
  intmax_t iVar9;
  ostream *poVar10;
  size_type sVar11;
  pair<unsigned_long,_bool> pVar12;
  string local_78;
  CFI *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  string *__range2;
  CIE *local_40;
  pointer local_38;
  
  this->frameInfo = fi;
  this->addressEncoding = '\0';
  this->addressSize = '\b';
  this->segmentSize = '\0';
  this->lsdaEncoding = '\0';
  this->isSignalHandler = false;
  this->initial_instructions = 0;
  this->end = end_;
  (this->personality).first = 0;
  (this->personality).second = false;
  local_50 = &this->augmentation;
  (this->augmentation)._M_dataplus._M_p = (pointer)&(this->augmentation).field_2;
  (this->augmentation)._M_string_length = 0;
  (this->augmentation).field_2._M_local_buf[0] = '\0';
  local_58 = fi;
  uVar6 = DWARFReader::getu8(r);
  this->version = uVar6;
  DWARFReader::getstring_abi_cxx11_(&local_78,r);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (local_50,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  if (3 < this->version) {
    uVar6 = DWARFReader::getu8(r);
    this->addressSize = uVar6;
    uVar6 = DWARFReader::getu8(r);
    this->segmentSize = uVar6;
  }
  uVar8 = DWARFReader::getuleb128(r);
  this->codeAlign = (uint)uVar8;
  iVar9 = DWARFReader::getsleb128(r);
  this->dataAlign = (int)iVar9;
  bVar7 = DWARFReader::getu8(r);
  this->rar = (uint)bVar7;
  this->addressEncoding = '\x04';
  local_38 = (pointer)r->off;
  pcVar2 = (this->augmentation)._M_dataplus._M_p;
  sVar3 = (this->augmentation)._M_string_length;
  __range2 = (string *)r;
  local_40 = this;
  for (sVar11 = 0; psVar4 = __range2, sVar3 != sVar11; sVar11 = sVar11 + 1) {
    cVar1 = pcVar2[sVar11];
    switch(cVar1) {
    case 'L':
      uVar6 = DWARFReader::getu8((DWARFReader *)__range2);
      local_40->lsdaEncoding = uVar6;
      break;
    case 'M':
    case 'N':
    case 'O':
    case 'Q':
switchD_00155888_caseD_4d:
      poVar10 = std::operator<<(((local_58->dwarf->elf).
                                 super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr)->context->debug,"unknown augmentation \'");
      poVar10 = std::operator<<(poVar10,cVar1);
      poVar10 = std::operator<<(poVar10,"\' in ");
      poVar10 = std::operator<<(poVar10,(string *)local_50);
      std::endl<char,std::char_traits<char>>(poVar10);
      goto LAB_00155960;
    case 'P':
      uVar6 = DWARFReader::getu8((DWARFReader *)__range2);
      pVar12 = CFI::decodeAddress(local_58,(DWARFReader *)psVar4,uVar6,local_58->sectionAddr);
      (local_40->personality).first = pVar12.first;
      (local_40->personality).second = pVar12.second;
      break;
    case 'R':
      uVar6 = DWARFReader::getu8((DWARFReader *)__range2);
      local_40->addressEncoding = uVar6;
      break;
    case 'S':
      local_40->isSignalHandler = true;
      break;
    default:
      if (cVar1 != '\0') {
        if (cVar1 != 'z') goto switchD_00155888_caseD_4d;
        uVar8 = DWARFReader::getuleb128((DWARFReader *)__range2);
        local_38 = (__range2->_M_dataplus)._M_p + uVar8;
      }
    }
  }
LAB_00155960:
  psVar4 = __range2;
  if ((__range2->_M_dataplus)._M_p != local_38) {
    poVar10 = std::operator<<(((local_58->dwarf->elf).
                               super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr)->context->debug,"warning: ");
    pCVar5 = local_40;
    poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
    poVar10 = std::operator<<(poVar10," bytes of augmentation ignored");
    std::endl<char,std::char_traits<char>>(poVar10);
    DWARFReader::setOffset((DWARFReader *)psVar4,(Off)local_38);
    local_38 = (psVar4->_M_dataplus)._M_p;
    local_40 = pCVar5;
  }
  local_40->initial_instructions = (Off)local_38;
  return;
}

Assistant:

CIE::CIE(const CFI *fi, DWARFReader &r, Elf::Off end_)
    : frameInfo(fi)
    , addressEncoding(0)
    , addressSize(ELF_BYTES)
    , segmentSize(0)
    , lsdaEncoding(0)
    , isSignalHandler(false)
    , initial_instructions(0)
    , end(end_)
    , personality{}
{
    version = r.getu8();
    augmentation = r.getstring();
    if (version >= 4) {
        addressSize = r.getu8();
        segmentSize = r.getu8();
    }
    codeAlign = r.getuleb128();
    dataAlign = r.getsleb128();
    rar = r.getu8();

#if ELF_BITS == 32
    addressEncoding = DW_EH_PE_udata4;
#elif ELF_BITS == 64
    addressEncoding = DW_EH_PE_udata8;
#else
    #error "no default address encoding"
#endif

    bool earlyExit = false;
    Elf::Off endaugdata = r.getOffset();
    for (auto aug : augmentation) {
        switch (aug) {
            case 'z':
                endaugdata = r.getuleb128();
                endaugdata += r.getOffset();
                break;
            case 'P':
                personality = fi->decodeAddress(r, r.getu8(), fi->sectionAddr );
                break;
            case 'L':
                lsdaEncoding = r.getu8();
                break;
            case 'R':
                addressEncoding = r.getu8();
                break;
            case 'S':
                isSignalHandler = true;
                break;
            case '\0':
                break;
            default:
                *fi->dwarf->elf->context.debug << "unknown augmentation '" << aug << "' in " << augmentation << std::endl;
                // The augmentations are in order, so we can't make any sense
                // of the remaining data in the augmentation block
                earlyExit = true;
                break;
        }
        if (earlyExit)
            break;
    }
    if (r.getOffset() != endaugdata) {
        *fi->dwarf->elf->context.debug << "warning: " << endaugdata - r.getOffset() << " bytes of augmentation ignored" << std::endl;
        r.setOffset(endaugdata);
    }
    initial_instructions = r.getOffset();
}